

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registration_manager.cpp
# Opt level: O2

shared_ptr<miniros::master::NodeRef> __thiscall
miniros::master::RegistrationManager::getNodeByAPIUnsafe(RegistrationManager *this,string *api)

{
  __type_conflict _Var1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  _Self __tmp;
  _Rb_tree_node_base *p_Var3;
  undefined1 auVar4 [16];
  shared_ptr<miniros::master::NodeRef> sVar5;
  string local_50;
  
  p_Var3 = *(_Rb_tree_node_base **)((long)&api[0xb].field_2 + 8);
  _Var2._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_RDX;
  do {
    if (p_Var3 == (_Rb_tree_node_base *)&api[0xb]._M_string_length) {
      *(undefined8 *)&(this->publishers).map._M_t._M_impl = 0;
      *(undefined8 *)&(this->publishers).map._M_t._M_impl.super__Rb_tree_header._M_header = 0;
LAB_00279d6e:
      sVar5.super___shared_ptr<miniros::master::NodeRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = _Var2._M_pi;
      sVar5.super___shared_ptr<miniros::master::NodeRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)this;
      return (shared_ptr<miniros::master::NodeRef>)
             sVar5.super___shared_ptr<miniros::master::NodeRef,_(__gnu_cxx::_Lock_policy)2>;
    }
    NodeRef::getApi_abi_cxx11_(&local_50,*(NodeRef **)(p_Var3 + 2));
    _Var1 = ::std::operator==(&local_50,in_RDX);
    ::std::__cxx11::string::~string((string *)&local_50);
    if (_Var1) {
      ::std::__shared_ptr<miniros::master::NodeRef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<miniros::master::NodeRef,_(__gnu_cxx::_Lock_policy)2> *)this,
                 (__shared_ptr<miniros::master::NodeRef,_(__gnu_cxx::_Lock_policy)2> *)(p_Var3 + 2))
      ;
      _Var2._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)extraout_RDX;
      goto LAB_00279d6e;
    }
    auVar4 = ::std::_Rb_tree_increment(p_Var3);
    _Var2._M_pi = auVar4._8_8_;
    p_Var3 = auVar4._0_8_;
  } while( true );
}

Assistant:

std::shared_ptr<NodeRef> RegistrationManager::getNodeByAPIUnsafe(const std::string& api) const
{
  for (auto it = m_nodes.begin(); it != m_nodes.end(); it++) {
    if (it->second->getApi() == api)
      return it->second;
  }
  return {};
}